

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O0

_Bool use_aux(command *cmd,object *obj,use use,wchar_t snd)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  effect *effect_00;
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  int iVar4;
  object *poVar5;
  source sVar6;
  wchar_t local_fc;
  char local_f8 [8];
  char name [80];
  object *used_obj;
  object *poStack_98;
  wchar_t adj;
  object *wcopy;
  anon_union_8_4_b62eeb40_for_which_conflict local_88;
  char local_79;
  object *poStack_78;
  char label;
  object *first_remainder;
  object *work_obj;
  _Bool used;
  int iStack_60;
  _Bool deduct_before;
  _Bool describe;
  _Bool ident;
  uint16_t number;
  wchar_t charges;
  wchar_t level;
  wchar_t boost;
  wchar_t beam;
  trap_kind *rune;
  wchar_t dir;
  _Bool none_left;
  _Bool known_aim;
  _Bool was_aware;
  wchar_t can_use;
  _Bool from_floor;
  effect *effect;
  wchar_t snd_local;
  use use_local;
  object *obj_local;
  command *cmd_local;
  
  effect._0_4_ = snd;
  effect._4_4_ = use;
  _snd_local = obj;
  obj_local = (object *)cmd;
  _can_use = object_effect(obj);
  _Var1 = object_is_carried(player,_snd_local);
  was_aware = (_Bool)((_Var1 ^ 0xffU) & 1);
  dir = L'\x01';
  rune._6_1_ = 0;
  rune._5_1_ = 0;
  rune._0_4_ = L'\x05';
  _boost = lookup_trap("glyph of warding");
  wVar2 = cmd_get_arg_item((command *)obj_local,"item",(object **)&snd_local);
  if (wVar2 != L'\0') {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-obj.c"
                  ,0x1a4,"_Bool use_aux(struct command *, struct object *, enum use, int)");
  }
  rune._7_1_ = object_flavor_is_aware(_snd_local);
  _Var1 = tval_is_wand(_snd_local);
  if (((((_Var1) || (_Var1 = tval_is_rod(_snd_local), _Var1)) || ((rune._7_1_ & 1) != 0)) ||
      ((_snd_local->effect != (effect *)0x0 && (_snd_local->known->effect == _snd_local->effect))))
     || ((_snd_local->activation != (activation *)0x0 &&
         (_snd_local->known->activation == _snd_local->activation)))) {
    rune._6_1_ = 1;
  }
  _Var1 = obj_needs_aim(_snd_local);
  if (_Var1) {
    if ((rune._6_1_ & 1) == 0) {
      uVar3 = Rand_div(8);
      rune._0_4_ = (wchar_t)ddd[(int)uVar3];
    }
    else {
      wVar2 = cmd_get_target((command *)obj_local,"target",(int *)&rune);
      if (wVar2 != L'\0') {
        return false;
      }
    }
    player_confuse_dir(player,(int *)&rune,false);
  }
  track_object(player->upkeep,_snd_local);
  if (_can_use != (effect *)0x0) {
    if ((effect._4_4_ == USE_CHARGE) || (effect._4_4_ == USE_TIMEOUT)) {
      dir = check_devices(_snd_local);
    }
    if (L'\0' < dir) {
      level = beam_chance((uint)_snd_local->tval);
      iStack_60 = 0;
      work_obj._5_1_ = 0;
      work_obj._4_1_ = 0;
      poStack_78 = (object *)0x0;
      local_79 = '\0';
      if ((was_aware & 1U) == 0) {
        local_79 = gear_to_label(player,_snd_local);
        if ((effect._4_4_ == USE_CHARGE) || (effect._4_4_ == USE_TIMEOUT)) {
          work_obj._6_2_ = (ushort)_snd_local->number;
        }
        else {
          work_obj._6_2_ = object_pack_total(player,_snd_local,false,&stack0xffffffffffffff88);
          if ((poStack_78 != (object *)0x0) && (poStack_78->number == work_obj._6_2_)) {
            poStack_78 = (object *)0x0;
          }
        }
      }
      else {
        work_obj._6_2_ = (ushort)_snd_local->number;
      }
      if (_snd_local->artifact == (artifact *)0x0) {
        if (_snd_local->activation == (activation *)0x0) {
          _describe = _snd_local->kind->level;
        }
        else {
          _describe = _snd_local->activation->level;
        }
      }
      else {
        _describe = _snd_local->artifact->level;
      }
      if (_snd_local->activation == (activation *)0x0) {
        if (_snd_local->kind->effect_msg == (char *)0x0) {
          if ((_snd_local->kind->vis_msg == (char *)0x0) || (player->timed[2] != 0)) {
            sound((wchar_t)effect);
          }
          else {
            msgt((wchar_t)effect,"%s",_snd_local->kind->vis_msg);
          }
        }
        else {
          msgt((wchar_t)effect,"%s",_snd_local->kind->effect_msg);
        }
      }
      else {
        msgt((wchar_t)effect,"You activate it.");
        activation_message(_snd_local,player);
      }
      if (((player->state).skills[2] - _describe) / 2 < 0) {
        local_fc = L'\0';
      }
      else {
        local_fc = ((player->state).skills[2] - _describe) / 2;
      }
      charges = local_fc;
      if ((was_aware & 1U) == 0) {
        work_obj._3_1_ = 0;
        first_remainder = object_new();
        object_copy(first_remainder,_snd_local);
        first_remainder->oidx = 0;
        if (_snd_local->known != (object *)0x0) {
          poVar5 = object_new();
          first_remainder->known = poVar5;
          object_copy(first_remainder->known,_snd_local->known);
          first_remainder->known->oidx = 0;
        }
      }
      else if (effect._4_4_ == USE_SINGLE) {
        work_obj._3_1_ = 1;
        first_remainder =
             floor_object_for_use(player,_snd_local,L'\x01',false,(_Bool *)((long)&rune + 5));
      }
      else {
        if (effect._4_4_ == USE_CHARGE) {
          work_obj._3_1_ = 1;
          iStack_60 = (int)_snd_local->pval;
          _snd_local->pval = _snd_local->pval + -1;
        }
        else if (effect._4_4_ == USE_TIMEOUT) {
          work_obj._3_1_ = 1;
          iStack_60 = (int)_snd_local->timeout;
          iVar4 = randcalc(_snd_local->time,0,RANDOMISE);
          _snd_local->timeout = _snd_local->timeout + (short)iVar4;
        }
        else {
          work_obj._3_1_ = 0;
        }
        first_remainder = object_new();
        object_copy(first_remainder,_snd_local);
        first_remainder->oidx = 0;
        if (_snd_local->known != (object *)0x0) {
          poVar5 = object_new();
          first_remainder->known = poVar5;
          object_copy(first_remainder->known,_snd_local->known);
          first_remainder->known->oidx = 0;
        }
      }
      target_fix();
      effect_00 = _can_use;
      sVar6 = source_player();
      wcopy._0_4_ = sVar6.what;
      sVar6._4_4_ = 0;
      sVar6.what = (anon_enum_32)wcopy;
      local_88 = sVar6.which;
      work_obj._2_1_ =
           effect_do(effect_00,sVar6,_snd_local,(_Bool *)((long)&work_obj + 5),
                     (_Bool)(rune._7_1_ & 1),(wchar_t)rune,level,charges,
                     (command_conflict *)obj_local);
      target_release();
      if ((work_obj._2_1_ & 1) == 0) {
        if ((work_obj._3_1_ & 1) != 0) {
          if (effect._4_4_ == USE_SINGLE) {
            poStack_98 = object_new();
            object_copy(poStack_98,first_remainder);
            if (first_remainder->known != (object *)0x0) {
              poVar5 = object_new();
              poStack_98->known = poVar5;
              object_copy(poStack_98->known,first_remainder->known);
            }
            if ((was_aware & 1U) == 0) {
              inven_carry(player,poStack_98,true,false);
            }
            else {
              grid.x = (player->grid).x;
              grid.y = (player->grid).y;
              drop_near((chunk *)cave,&stack0xffffffffffffff68,L'\0',grid,false,true);
            }
          }
          else if (effect._4_4_ == USE_CHARGE) {
            _snd_local->pval = (int16_t)iStack_60;
          }
          else if (effect._4_4_ == USE_TIMEOUT) {
            _snd_local->timeout = (int16_t)iStack_60;
          }
        }
        if (((rune._7_1_ & 1) != 0) || ((work_obj._5_1_ & 1) == 0)) {
          if (first_remainder->known != (object *)0x0) {
            object_delete((chunk *)player->cave,(chunk *)0x0,&first_remainder->known);
          }
          object_delete((chunk *)cave,(chunk *)player->cave,&first_remainder);
          if ((work_obj._3_1_ & 1) != 0) {
            if ((was_aware & 1U) == 0) {
              __assert_fail("from_floor",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-obj.c"
                            ,0x271,"_Bool use_aux(struct command *, struct object *, enum use, int)"
                           );
            }
            player->upkeep->redraw = player->upkeep->redraw | 0x200000;
          }
          return false;
        }
      }
      if (effect._4_4_ == USE_SINGLE) {
        if ((rune._7_1_ & 1) == 0) {
          object_learn_on_use(player,first_remainder);
        }
        work_obj._4_1_ = 1;
      }
      else {
        _Var1 = tval_is_wearable(first_remainder);
        if (_Var1) {
          update_player_object_knowledge(player);
        }
        else if (((rune._7_1_ & 1) == 0) && ((work_obj._5_1_ & 1) != 0)) {
          object_learn_on_use(player,first_remainder);
          work_obj._4_1_ = 1;
        }
        else {
          object_flavor_tried(first_remainder);
        }
      }
      if (((work_obj._2_1_ & 1) != 0) && ((work_obj._3_1_ & 1) == 0)) {
        if ((was_aware & 1U) != 0) {
          __assert_fail("!from_floor",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-obj.c"
                        ,0x293,"_Bool use_aux(struct command *, struct object *, enum use, int)");
        }
        if (effect._4_4_ == USE_CHARGE) {
          _snd_local->pval = _snd_local->pval + -1;
          first_remainder->pval = first_remainder->pval + -1;
        }
        else if (effect._4_4_ == USE_TIMEOUT) {
          iVar4 = randcalc(_snd_local->time,0,RANDOMISE);
          _snd_local->timeout = _snd_local->timeout + (short)iVar4;
          first_remainder->timeout = first_remainder->timeout + (short)iVar4;
        }
        else if (effect._4_4_ == USE_SINGLE) {
          name._72_8_ = gear_object_for_use(player,_snd_local,L'\x01',false,
                                            (_Bool *)((long)&rune + 5));
          if (((object *)name._72_8_)->known != (object *)0x0) {
            object_delete((chunk *)cave,(chunk *)player->cave,&((object *)name._72_8_)->known);
          }
          object_delete((chunk *)cave,(chunk *)player->cave,(object **)(name + 0x48));
        }
      }
      if ((work_obj._4_1_ & 1) == 0) {
        if (((work_obj._2_1_ & 1) != 0) && (effect._4_4_ == USE_CHARGE)) {
          if ((was_aware & 1U) == 0) {
            inven_item_charges(first_remainder);
          }
          else {
            floor_item_charges(first_remainder);
          }
        }
      }
      else {
        iVar4 = 0;
        if ((work_obj._2_1_ & 1) != 0 && effect._4_4_ == USE_SINGLE) {
          iVar4 = -1;
        }
        object_desc(local_f8,0x50,first_remainder,((uint)work_obj._6_2_ + iVar4) * 0x10000 | 0x443,
                    player);
        if ((was_aware & 1U) == 0) {
          if (poStack_78 == (object *)0x0) {
            msg("You have %s (%c).",local_f8,(ulong)(uint)(int)local_79);
          }
          else {
            local_79 = gear_to_label(player,poStack_78);
            msg("You have %s (1st %c).",local_f8,(ulong)(uint)(int)local_79);
          }
        }
        else {
          msg("You see %s.",local_f8);
        }
      }
      if (first_remainder->known != (object *)0x0) {
        object_delete((chunk *)player->cave,(chunk *)0x0,&first_remainder->known);
      }
      object_delete((chunk *)cave,(chunk *)player->cave,&first_remainder);
    }
    player->upkeep->energy_use = (uint)z_info->move_energy;
    if (((rune._5_1_ & 1) == 0) && ((was_aware & 1U) == 0)) {
      apply_autoinscription(player,_snd_local);
    }
    player->upkeep->notice = player->upkeep->notice | 1;
    player->upkeep->redraw = player->upkeep->redraw | 0x260000;
    grid_00.x = (player->grid).x;
    grid_00.y = (player->grid).y;
    _Var1 = square_trap_specific((chunk_conflict2 *)cave,grid_00,_boost->tidx);
    if ((_Var1) &&
       (grid_01.x = (player->grid).x, grid_01.y = (player->grid).y,
       poVar5 = square_object((chunk *)cave,grid_01), poVar5 != (object *)0x0)) {
      grid_02.x = (player->grid).x;
      grid_02.y = (player->grid).y;
      push_object(grid_02);
    }
    return dir == L'\0';
  }
  __assert_fail("effect",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-obj.c",
                0x1bf,"_Bool use_aux(struct command *, struct object *, enum use, int)");
}

Assistant:

static bool use_aux(struct command *cmd, struct object *obj, enum use use,
					int snd)
{
	struct effect *effect = object_effect(obj);
	bool from_floor = !object_is_carried(player, obj);
	int can_use = 1;
	bool was_aware;
	bool known_aim = false;
	bool none_left = false;
	int dir = 5;
	struct trap_kind *rune = lookup_trap("glyph of warding");

	/* Get arguments */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) assert(0);

	was_aware = object_flavor_is_aware(obj);

	/* Determine whether we know an item needs to be be aimed */
	if (tval_is_wand(obj) || tval_is_rod(obj) || was_aware ||
		(obj->effect && (obj->known->effect == obj->effect)) ||
		(obj->activation && (obj->known->activation == obj->activation))) {
		known_aim = true;
	}

	if (obj_needs_aim(obj)) {
		/* Unknown things with no obvious aim get a random direction */
		if (!known_aim) {
			dir = ddd[randint0(8)];
		} else if (cmd_get_target(cmd, "target", &dir) != CMD_OK) {
			return false;
		}

		/* Confusion wrecks aim */
		player_confuse_dir(player, &dir, false);
	}

	/* track the object used */
	track_object(player->upkeep, obj);

	/* Verify effect */
	assert(effect);

	/* Check for use if necessary */
	if ((use == USE_CHARGE) || (use == USE_TIMEOUT)) {
		can_use = check_devices(obj);
	}

	/* Execute the effect */
	if (can_use > 0) {
		int beam = beam_chance(obj->tval);
		int boost, level, charges = 0;
		uint16_t number;
		bool ident = false, describe = false, deduct_before, used;
		struct object *work_obj;
		struct object *first_remainder = NULL;
		char label = '\0';

		if (from_floor) {
			number = obj->number;
		} else {
			label = gear_to_label(player, obj);
			/*
			 * Show an aggregate total if the description doesn't
			 * have a charge/recharging notice specific to the
			 * stack.
			 */
			if (use != USE_CHARGE && use != USE_TIMEOUT) {
				number = object_pack_total(player, obj, false,
					&first_remainder);
				if (first_remainder && first_remainder->number
						== number) {
					first_remainder = NULL;
				}
			} else {
				number = obj->number;
			}
		}

		/* Get the level */
		if (obj->artifact)
			level = obj->artifact->level;
		else if (obj->activation)
			level = obj->activation->level;
		else
			level = obj->kind->level;

		/* Sound and/or message */
		if (obj->activation) {
			msgt(snd, "You activate it.");
			activation_message(obj, player);
		} else if (obj->kind->effect_msg) {
			msgt(snd, "%s", obj->kind->effect_msg);
		} else if (obj->kind->vis_msg && !player->timed[TMD_BLIND]) {
			msgt(snd, "%s", obj->kind->vis_msg);
		} else {
			/* Make a noise! */
			sound(snd);
		}

		/* Boost damage effects if skill > difficulty */
		boost = MAX((player->state.skills[SKILL_DEVICE] - level) / 2, 0);

		/*
		 * If the object is on the floor, tentatively deduct the
		 * amount used - the effect could leave the object inaccessible
		 * making it difficult to do after a successful use.  For the
		 * same reason, get a copy of the object to use for propagating
		 * knowledge and messaging (also do so for items in the pack
		 * to keep later logic simpler).  Don't do the deduction for
		 * an object in the pack because the rearrangement of the
		 * pack, if using a stack of one single use item, can distract
		 * the player, see
		 * https://github.com/angband/angband/issues/5543 .
		 * If effects change so that the originating object can be
		 * destroyed even if in the pack, the deduction would have to
		 * be done here if the item is in the pack as well.
		 */
		if (from_floor) {
			if (use == USE_SINGLE) {
				deduct_before = true;
				work_obj = floor_object_for_use(player, obj, 1,
					false, &none_left);
			} else {
				if (use == USE_CHARGE) {
					deduct_before = true;
					charges = obj->pval;
					/* Use a single charge */
					obj->pval--;
				} else if (use == USE_TIMEOUT) {
					deduct_before = true;
					charges = obj->timeout;
					obj->timeout += randcalc(obj->time, 0,
						RANDOMISE);
				} else {
					deduct_before = false;
				}
				work_obj = object_new();
				object_copy(work_obj, obj);
				work_obj->oidx = 0;
				if (obj->known) {
					work_obj->known = object_new();
					object_copy(work_obj->known,
						obj->known);
					work_obj->known->oidx = 0;
				}
			}
		} else {
			deduct_before = false;
			work_obj = object_new();
			object_copy(work_obj, obj);
			work_obj->oidx = 0;
			if (obj->known) {
				work_obj->known = object_new();
				object_copy(work_obj->known, obj->known);
				work_obj->known->oidx = 0;
			}
		}

		/* Do effect; use original not copy (proj. effect handling) */
		target_fix();
		used = effect_do(effect,
							source_player(),
							obj,
							&ident,
							was_aware,
							dir,
							beam,
							boost,
							cmd);
		target_release();

		if (!used) {
			if (deduct_before) {
				/* Restore the tentative deduction. */
				if (use == USE_SINGLE) {
					/*
					 * Drop/stash copy to simplify
					 * subsequent logic.
					 */
					struct object *wcopy = object_new();

					object_copy(wcopy, work_obj);
					if (work_obj->known) {
						wcopy->known = object_new();
						object_copy(wcopy->known,
							work_obj->known);
					}
					if (from_floor) {
						drop_near(cave, &wcopy, 0,
							player->grid, false,
							true);
					} else {
						inven_carry(player, wcopy,
							true, false);
					}
				} else if (use == USE_CHARGE) {
					obj->pval = charges;
				} else if (use == USE_TIMEOUT) {
					obj->timeout = charges;
				}
			}

			/*
			 * Quit if the item wasn't used and no knowledge was
			 * gained
			 */
			if (was_aware || !ident) {
				if (work_obj->known) {
					object_delete(player->cave, NULL, &work_obj->known);
				}
				object_delete(cave, player->cave, &work_obj);
				/*
				 * Selection of effect's target may have
				 * triggered an update to windows while the
				 * tentative deduction was in effect; signal
				 * another update to remedy that.
				 */
				if (deduct_before) {
					assert(from_floor);
					player->upkeep->redraw |= (PR_OBJECT);
				}
				return false;
			}
		}

		/* Increase knowledge */
		if (use == USE_SINGLE) {
			/* Single use items are automatically learned */
			if (!was_aware) {
				object_learn_on_use(player, work_obj);
			}
			describe = true;
		} else {
			/* Wearables may need update, other things become known or tried */
			if (tval_is_wearable(work_obj)) {
				update_player_object_knowledge(player);
			} else if (!was_aware && ident) {
				object_learn_on_use(player, work_obj);
				describe = true;
			} else {
				object_flavor_tried(work_obj);
			}
		}

		/*
		 * Use up, deduct charge, or apply timeout if it wasn't
		 * done before.  For charges or timeouts, also have to change
		 * work_obj since it is used for messaging (for single use
		 * items, ODESC_ALTNUM means that the work_obj's number doesn't
		 * need to be adjusted).
		 */
		if (used && !deduct_before) {
			assert(!from_floor);
			if (use == USE_CHARGE) {
				obj->pval--;
				work_obj->pval--;
			} else if (use == USE_TIMEOUT) {
				int adj = randcalc(obj->time, 0, RANDOMISE);

				obj->timeout += adj;
				work_obj->timeout += adj;
			} else if (use == USE_SINGLE) {
				struct object *used_obj = gear_object_for_use(
					player, obj, 1, false, &none_left);

				if (used_obj->known) {
					object_delete(cave, player->cave,
						&used_obj->known);
				}
				object_delete(cave, player->cave, &used_obj);
			}
		}

		if (describe) {
			/*
			 * Describe what's left of single use items or newly
			 * identified items of all kinds.
			 */
			char name[80];

			object_desc(name, sizeof(name), work_obj,
				ODESC_PREFIX | ODESC_FULL | ODESC_ALTNUM |
				((number + ((used && use == USE_SINGLE) ?
				-1 : 0)) << 16), player);
			if (from_floor) {
				/* Print a message */
				msg("You see %s.", name);
			} else if (first_remainder) {
				label = gear_to_label(player, first_remainder);
				msg("You have %s (1st %c).", name, label);
			} else {
				msg("You have %s (%c).", name, label);
			}
		} else if (used && use == USE_CHARGE) {
			/* Describe charges */
			if (from_floor)
				floor_item_charges(work_obj);
			else
				inven_item_charges(work_obj);
		}

		/* Clean up created copy. */
		if (work_obj->known)
			object_delete(player->cave, NULL, &work_obj->known);
		object_delete(cave, player->cave, &work_obj);
	}

	/* Use the turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Autoinscribe if we are guaranteed to still have any */
	if (!none_left && !from_floor)
		apply_autoinscription(player, obj);

	/* Mark as tried and redisplay */
	player->upkeep->notice |= (PN_COMBINE);
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP | PR_OBJECT);

	/* Hack to make Glyph of Warding work properly */
	if (square_trap_specific(cave, player->grid, rune->tidx)) {
		/* Push objects off the grid */
		if (square_object(cave, player->grid))
			push_object(player->grid);
	}

	return can_use == 0;
}